

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O2

void __thiscall gvr::PLYWriter::addElement(PLYWriter *this,string *name,long instances)

{
  PLYElement *this_00;
  IOException *this_01;
  allocator local_49;
  string local_48;
  
  if (this->header_complete != true) {
    this_00 = (PLYElement *)operator_new(0x40);
    PLYElement::PLYElement(this_00,name,instances);
    this->element = this_00;
    std::vector<gvr::PLYElement_*,_std::allocator<gvr::PLYElement_*>_>::push_back
              (&this->list,&this->element);
    return;
  }
  this_01 = (IOException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_48,"Creation of ply header has been completed",&local_49);
  gutil::IOException::IOException(this_01,&local_48);
  __cxa_throw(this_01,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
}

Assistant:

void PLYWriter::addElement(const std::string &name, long instances)
{
  if (header_complete)
  {
    throw gutil::IOException("Creation of ply header has been completed");
  }

  element=new PLYElement(name, instances);

  list.push_back(element);
}